

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O1

double xc_bessel_I1_scaled(double x)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = 0.0;
  if ((x != 0.0) || (NAN(x))) {
    dVar2 = ABS(x);
    if (dVar2 < 4.450147717014403e-308) {
      xc_bessel_I1_scaled_cold_1();
      dVar2 = 0.0;
    }
    else if (4.2146848510894035e-08 <= dVar2) {
      if (dVar2 <= 3.0) {
        dVar3 = exp(-dVar2);
        dVar4 = (x * x) / 4.5 + -1.0;
        uVar1 = 0xc;
        dVar2 = 0.0;
        dVar6 = 0.0;
        do {
          dVar5 = dVar2;
          dVar7 = ((dVar4 + dVar4) * dVar6 - dVar5) + ai02_data[uVar1 + 0x14];
          uVar1 = uVar1 - 1;
          dVar2 = dVar6;
          dVar6 = dVar7;
        } while (1 < uVar1);
        dVar2 = ((dVar7 - dVar5) * 0.5 + 0.875) * dVar3 * x;
      }
      else {
        if (dVar2 <= 8.0) {
          dVar4 = (48.0 / dVar2 + -11.0) / 5.0;
          uVar1 = 0x16;
          dVar6 = 0.0;
          dVar3 = 0.0;
          do {
            dVar5 = dVar6;
            dVar7 = ((dVar4 + dVar4) * dVar3 - dVar5) + bi1_data[uVar1 + 10];
            uVar1 = uVar1 - 1;
            dVar6 = dVar3;
            dVar3 = dVar7;
          } while (1 < uVar1);
        }
        else {
          dVar4 = 16.0 / dVar2 + -1.0;
          uVar1 = 0x17;
          dVar6 = 0.0;
          dVar3 = 0.0;
          do {
            dVar5 = dVar6;
            dVar7 = ((dVar4 + dVar4) * dVar3 - dVar5) + ai1_data[uVar1 + 0x14];
            uVar1 = uVar1 - 1;
            dVar6 = dVar3;
            dVar3 = dVar7;
          } while (1 < uVar1);
        }
        if (dVar2 < 0.0) {
          dVar2 = sqrt(dVar2);
        }
        else {
          dVar2 = SQRT(dVar2);
        }
        dVar2 = ((dVar7 - dVar5) * 0.5 + 0.375) / dVar2;
        dVar2 = (double)(~-(ulong)(0.0 < x) & (ulong)-dVar2 | (ulong)dVar2 & -(ulong)(0.0 < x));
      }
    }
    else {
      dVar2 = exp(-dVar2);
      dVar2 = dVar2 * x * 0.5;
    }
  }
  return dVar2;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I1_scaled(const double x)
{
  const double xmin    = 2.0 * DBL_MIN;
  const double x_small = 2.0 * M_SQRT2 * SQRT_DBL_EPSILON;
  const double y = fabs(x);
  double r = 0.0;

  if(y == 0.0)
    r = 0.0;
  else if(y < xmin) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Underflow error in bessel_I1_scaled\n");
#endif
  } else if(y < x_small)
    r = 0.5*x*exp(-y);
  else if(y <= 3.0)
    r = x*exp(-y)*(0.875 + xc_cheb_eval(y*y/4.5 - 1.0, bi1_data, 11));
  else{
    if(y <= 8.0)
      r = (0.375 + xc_cheb_eval((48.0/y - 11.0)/5.0, ai1_data, 21))/sqrt(y);
    else
      r = (0.375 + xc_cheb_eval(16.0/y - 1.0, ai12_data, 22))/sqrt(y);

    r *= (x > 0.0 ? 1.0 : -1.0);
  }

  return r;
}